

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

double GetLoadAverage(void)

{
  int iVar1;
  double local_28;
  double loadavg [3];
  
  memset(&local_28,0,0x18);
  iVar1 = getloadavg(&local_28,3);
  if (iVar1 < 0) {
    loadavg[2] = -0.0;
  }
  else {
    loadavg[2] = local_28;
  }
  return loadavg[2];
}

Assistant:

double GetLoadAverage() {
  double loadavg[3] = { 0.0f, 0.0f, 0.0f };
  if (getloadavg(loadavg, 3) < 0) {
    // Maybe we should return an error here or the availability of
    // getloadavg(3) should be checked when ninja is configured.
    return -0.0f;
  }
  return loadavg[0];
}